

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

TestCase *
vkt::createFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
          (TestContext *testCtx,TestNodeType type,string *name,string *desc,Function initPrograms,
          Function testFunction,InstanceContext *arg0)

{
  Function func_;
  Function desc_00;
  string *name_00;
  TestNodeType type_00;
  TestContext *testCtx_00;
  InstanceFactory1<vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>,_vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::Args,_vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>_>
  *this;
  InstanceContext local_218;
  Args local_138;
  FunctionPrograms1<vkt::SpirVAssembly::InstanceContext> local_40;
  Function local_38;
  Function testFunction_local;
  Function initPrograms_local;
  string *desc_local;
  string *name_local;
  TestContext *pTStack_10;
  TestNodeType type_local;
  TestContext *testCtx_local;
  
  local_38 = testFunction;
  testFunction_local = (Function)initPrograms;
  initPrograms_local = (Function)desc;
  desc_local = name;
  name_local._4_4_ = type;
  pTStack_10 = testCtx;
  this = (InstanceFactory1<vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>,_vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::Args,_vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>_>
          *)operator_new(0x160);
  testCtx_00 = pTStack_10;
  type_00 = name_local._4_4_;
  name_00 = desc_local;
  desc_00 = initPrograms_local;
  FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>::FunctionPrograms1
            (&local_40,(Function)testFunction_local);
  func_ = local_38;
  SpirVAssembly::InstanceContext::InstanceContext(&local_218,arg0);
  FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::Args::Args(&local_138,func_,&local_218);
  InstanceFactory1<vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>,_vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::Args,_vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>_>
  ::InstanceFactory1(this,testCtx_00,type_00,name_00,(string *)desc_00,&local_40,&local_138);
  FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::Args::~Args(&local_138);
  SpirVAssembly::InstanceContext::~InstanceContext(&local_218);
  return &this->super_TestCase;
}

Assistant:

TestCase* createFunctionCaseWithPrograms (tcu::TestContext&								testCtx,
										  tcu::TestNodeType								type,
										  const std::string&							name,
										  const std::string&							desc,
										  typename FunctionPrograms1<Arg0>::Function	initPrograms,
										  typename FunctionInstance1<Arg0>::Function	testFunction,
										  Arg0											arg0)
{
	return new InstanceFactory1<FunctionInstance1<Arg0>, typename FunctionInstance1<Arg0>::Args, FunctionPrograms1<Arg0> >(
		testCtx, type, name, desc, FunctionPrograms1<Arg0>(initPrograms), typename FunctionInstance1<Arg0>::Args(testFunction, arg0));
}